

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::StringMakerBase<true>::
         convert<std::basic_string_view<char,std::char_traits<char>>>
                   (basic_string_view<char,_std::char_traits<char>_> *in)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ostream *stream;
  basic_string_view<char,_std::char_traits<char>_> *stream_00;
  
  stream_00 = in_RDI;
  tlssPush();
  filloss<std::basic_string_view<char,std::char_traits<char>>>((ostream *)stream_00,in_RDI);
  tlssPop();
  return (String *)stream_00;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
                /* When parameter "in" is a null terminated const char* it works.
                 * When parameter "in" is a T arr[N] without '\0' we can fill the
                 * stringstream with N objects (T=char).If in is char pointer *
                 * without '\0' , it would cause segfault
                 * stepping over unaccessible memory.
                 */

                std::ostream* stream = tlssPush();
                filloss(stream, in);
                return tlssPop();
            }